

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool QMetaType::canConvert(QMetaType fromType,QMetaType toType)

{
  long lVar1;
  QMetaType toType_00;
  QMetaType toType_01;
  QMetaType toType_02;
  QMetaType toType_03;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  QMetaTypeModuleHelper *pQVar8;
  function<bool_(const_void_*,_void_*)> *pfVar9;
  QMetaType in_RSI;
  long in_FS_OFFSET;
  ConverterFunction *f;
  QMetaTypeModuleHelper *moduleHelper;
  int toTypeId;
  int fromTypeId;
  undefined4 in_stack_ffffffffffffff18;
  TypeFlag in_stack_ffffffffffffff1c;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar10;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QMetaType in_stack_ffffffffffffff38;
  QMetaType in_stack_ffffffffffffff40;
  QMetaType in_stack_ffffffffffffff48;
  pair<int,_int> in_stack_ffffffffffffff58;
  bool local_91;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_7c;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_68;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_64;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_50;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_4c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = id((QMetaType *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
             in_stack_ffffffffffffff1c);
  uVar4 = id((QMetaType *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
             in_stack_ffffffffffffff1c);
  if ((uVar3 == 0) || (uVar4 == 0)) {
    local_91 = false;
  }
  else if (uVar3 == uVar4) {
    local_91 = true;
  }
  else {
    piVar7 = qMax<int>((int *)&stack0xffffffffffffffe4,(int *)&stack0xffffffffffffffe0);
    pQVar8 = qModuleHelperForType(*piVar7);
    if ((pQVar8 == (QMetaTypeModuleHelper *)0x0) ||
       (uVar5 = (*pQVar8->_vptr_QMetaTypeModuleHelper[1])(pQVar8,0,(ulong)uVar3,0,(ulong)uVar4),
       (uVar5 & 1) == 0)) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
      ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
                    *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::make_pair<int&,int&>
                ((int *)CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                 (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      pfVar9 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
               ::function((QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
                           *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          in_stack_ffffffffffffff58);
      if (pfVar9 == (function<bool_(const_void_*,_void_*)> *)0x0) {
        uVar5 = uVar4;
        uVar6 = qMetaTypeId<QSequentialIterable>();
        if (uVar4 == uVar6) {
          local_91 = canConvertToSequentialIterable(in_stack_ffffffffffffff38);
        }
        else {
          uVar4 = uVar5;
          uVar6 = qMetaTypeId<QAssociativeIterable>();
          if (uVar5 == uVar6) {
            local_91 = canConvertToAssociativeIterable(in_stack_ffffffffffffff38);
          }
          else {
            if (uVar4 == 9) {
              in_stack_ffffffffffffff48 = fromType<QSequentialIterable>();
              toType_00.d_ptr._4_4_ = uVar3;
              toType_00.d_ptr._0_4_ = uVar4;
              bVar2 = canConvert(in_RSI,toType_00);
              if (bVar2) {
                local_91 = true;
                goto LAB_0038b34d;
              }
            }
            if ((uVar4 == 0x1c) || (uVar4 == 8)) {
              in_stack_ffffffffffffff40 = fromType<QAssociativeIterable>();
              toType_01.d_ptr._4_4_ = uVar3;
              toType_01.d_ptr._0_4_ = uVar4;
              bVar2 = canConvert(in_RSI,toType_01);
              if (bVar2) {
                local_91 = true;
                goto LAB_0038b34d;
              }
            }
            if (uVar4 == 0x3a) {
              fromType<QtMetaTypePrivate::QPairVariantInterfaceImpl>();
              bVar2 = hasRegisteredConverterFunction
                                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
              if (bVar2) {
                local_91 = true;
                goto LAB_0038b34d;
              }
            }
            local_50.super_QFlagsStorage<QMetaType::TypeFlag>.i =
                 (QFlagsStorage<QMetaType::TypeFlag>)
                 flags((QMetaType *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
            local_4c.super_QFlagsStorage<QMetaType::TypeFlag>.i =
                 (QFlagsStorage<QMetaType::TypeFlag>)
                 QFlags<QMetaType::TypeFlag>::operator&
                           ((QFlags<QMetaType::TypeFlag> *)
                            CONCAT17(in_stack_ffffffffffffff27,
                                     CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                            in_stack_ffffffffffffff1c);
            bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_4c);
            if (bVar2) {
              if ((uVar4 == 10) || (uVar4 == 0xc)) {
                local_91 = true;
              }
              else {
                QMetaType((QMetaType *)
                          CONCAT17(in_stack_ffffffffffffff27,
                                   CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                          in_stack_ffffffffffffff1c);
                toType_02.d_ptr._4_4_ = uVar3;
                toType_02.d_ptr._0_4_ = uVar4;
                local_91 = canConvert(in_RSI,toType_02);
              }
            }
            else {
              local_68.super_QFlagsStorage<QMetaType::TypeFlag>.i =
                   (QFlagsStorage<QMetaType::TypeFlag>)
                   flags((QMetaType *)
                         CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
              local_64.super_QFlagsStorage<QMetaType::TypeFlag>.i =
                   (QFlagsStorage<QMetaType::TypeFlag>)
                   QFlags<QMetaType::TypeFlag>::operator&
                             ((QFlags<QMetaType::TypeFlag> *)
                              CONCAT17(in_stack_ffffffffffffff27,
                                       CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)
                                      ),in_stack_ffffffffffffff1c);
              bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_64);
              if (bVar2) {
                if ((uVar3 == 10) || (uVar3 == 0xc)) {
                  local_91 = true;
                }
                else {
                  QMetaType((QMetaType *)
                            CONCAT17(in_stack_ffffffffffffff27,
                                     CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                            in_stack_ffffffffffffff1c);
                  toType_03.d_ptr._4_4_ = uVar3;
                  toType_03.d_ptr._0_4_ = uVar4;
                  local_91 = canConvert(in_RSI,toType_03);
                }
              }
              else {
                uVar10 = false;
                if (uVar4 == 0x33) {
                  flags((QMetaType *)
                        (ulong)CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20));
                  local_7c.super_QFlagsStorage<QMetaType::TypeFlag>.i =
                       (QFlagsStorage<QMetaType::TypeFlag>)
                       QFlags<QMetaType::TypeFlag>::operator&
                                 ((QFlags<QMetaType::TypeFlag> *)
                                  CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff26,
                                                           in_stack_ffffffffffffff20)),
                                  in_stack_ffffffffffffff1c);
                  uVar10 = ::QFlags::operator_cast_to_bool((QFlags *)&local_7c);
                }
                if ((bool)uVar10 == false) {
                  bVar2 = canConvertMetaObject(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
                  if (bVar2) {
                    local_91 = true;
                  }
                  else {
                    local_91 = false;
                  }
                }
                else {
                  local_91 = true;
                }
              }
            }
          }
        }
      }
      else {
        local_91 = true;
      }
    }
    else {
      local_91 = true;
    }
  }
LAB_0038b34d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_91;
}

Assistant:

bool QMetaType::canConvert(QMetaType fromType, QMetaType toType)
{
    int fromTypeId = fromType.id();
    int toTypeId = toType.id();

    if (fromTypeId == UnknownType || toTypeId == UnknownType)
        return false;

    if (fromTypeId == toTypeId)
        return true;

    if (auto moduleHelper = qModuleHelperForType(qMax(fromTypeId, toTypeId))) {
        if (moduleHelper->convert(nullptr, fromTypeId, nullptr, toTypeId))
            return true;
    }
    const ConverterFunction * const f =
        customTypesConversionRegistry()->function(std::make_pair(fromTypeId, toTypeId));
    if (f)
        return true;

    if (toTypeId == qMetaTypeId<QSequentialIterable>())
        return canConvertToSequentialIterable(fromType);

    if (toTypeId == qMetaTypeId<QAssociativeIterable>())
        return canConvertToAssociativeIterable(fromType);
    if (toTypeId == QVariantList
            && canConvert(fromType, QMetaType::fromType<QSequentialIterable>())) {
        return true;
    }

    if ((toTypeId == QVariantHash || toTypeId == QVariantMap)
            && canConvert(fromType, QMetaType::fromType<QAssociativeIterable>())) {
        return true;
    }

    if (toTypeId == QVariantPair && hasRegisteredConverterFunction(
                    fromType, QMetaType::fromType<QtMetaTypePrivate::QPairVariantInterfaceImpl>()))
        return true;

    if (fromType.flags() & IsEnumeration) {
        if (toTypeId == QString || toTypeId == QByteArray)
            return true;
        return canConvert(QMetaType(LongLong), toType);
    }
    if (toType.flags() & IsEnumeration) {
        if (fromTypeId == QString || fromTypeId == QByteArray)
            return true;
        return canConvert(fromType, QMetaType(LongLong));
    }
    if (toTypeId == Nullptr && fromType.flags() & IsPointer)
        return true;
    if (canConvertMetaObject(fromType, toType))
        return true;

    return false;
}